

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall wabt::MemoryStream::MemoryStream(MemoryStream *this,Stream *log_stream)

{
  OutputBuffer *pOVar1;
  
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__MemoryStream_00180f38;
  pOVar1 = (OutputBuffer *)operator_new(0x18);
  *(undefined8 *)&(pOVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> =
       0;
  *(pointer *)
   ((long)&(pOVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(pOVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10)
       = (pointer)0x0;
  (this->buf_)._M_t.
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl = pOVar1;
  return;
}

Assistant:

MemoryStream::MemoryStream(Stream* log_stream)
    : Stream(log_stream), buf_(new OutputBuffer()) {}